

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::
CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test::
~CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test
          (CopySourceCodeInfoToTest_CopyTo_DoesNotCopySourceCodeInfo_Test *this)

{
  CopySourceCodeInfoToTest::~CopySourceCodeInfoToTest(&this->super_CopySourceCodeInfoToTest);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CopySourceCodeInfoToTest, CopyTo_DoesNotCopySourceCodeInfo) {
  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));
  FileDescriptorProto file_desc_proto;
  ASSERT_FALSE(file_desc_proto.has_source_code_info());

  file_desc->CopyTo(&file_desc_proto);
  EXPECT_FALSE(file_desc_proto.has_source_code_info());
}